

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::WeightParams::InternalSwap(WeightParams *this,WeightParams *other)

{
  Arena *rhs_arena_00;
  Arena *lhs_arena_00;
  string *psVar1;
  Arena *rhs_arena;
  Arena *lhs_arena;
  WeightParams *other_local;
  WeightParams *this_local;
  
  rhs_arena_00 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
  lhs_arena_00 = google::protobuf::MessageLite::GetArenaForAllocation(&other->super_MessageLite);
  google::protobuf::internal::InternalMetadata::InternalSwap
            (&(this->super_MessageLite)._internal_metadata_,
             &(other->super_MessageLite)._internal_metadata_);
  google::protobuf::RepeatedField<float>::InternalSwap(&this->floatvalue_,&other->floatvalue_);
  psVar1 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::InternalSwap
            (psVar1,&this->float16value_,rhs_arena_00,&other->float16value_,lhs_arena_00);
  psVar1 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::InternalSwap
            (psVar1,&this->rawvalue_,rhs_arena_00,&other->rawvalue_,lhs_arena_00);
  psVar1 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::InternalSwap
            (psVar1,&this->int8rawvalue_,rhs_arena_00,&other->int8rawvalue_,lhs_arena_00);
  google::protobuf::internal::memswap<9>((char *)&this->quantization_,(char *)&other->quantization_)
  ;
  return;
}

Assistant:

void WeightParams::InternalSwap(WeightParams* other) {
  using std::swap;
  auto* lhs_arena = GetArenaForAllocation();
  auto* rhs_arena = other->GetArenaForAllocation();
  _internal_metadata_.InternalSwap(&other->_internal_metadata_);
  floatvalue_.InternalSwap(&other->floatvalue_);
  ::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::InternalSwap(
      &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
      &float16value_, lhs_arena,
      &other->float16value_, rhs_arena
  );
  ::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::InternalSwap(
      &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
      &rawvalue_, lhs_arena,
      &other->rawvalue_, rhs_arena
  );
  ::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::InternalSwap(
      &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
      &int8rawvalue_, lhs_arena,
      &other->int8rawvalue_, rhs_arena
  );
  ::PROTOBUF_NAMESPACE_ID::internal::memswap<
      PROTOBUF_FIELD_OFFSET(WeightParams, isupdatable_)
      + sizeof(WeightParams::isupdatable_)
      - PROTOBUF_FIELD_OFFSET(WeightParams, quantization_)>(
          reinterpret_cast<char*>(&quantization_),
          reinterpret_cast<char*>(&other->quantization_));
}